

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O2

int GetMultReg(char *oper,int loc)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint unaff_EBX;
  uint uVar7;
  byte *pbVar8;
  bool bVar9;
  
  iVar2 = IsOperator(oper);
  if (iVar2 == 0) {
    bVar9 = false;
    uVar7 = 0;
    while( true ) {
      iVar2 = 0;
      pbVar1 = (byte *)oper;
      while( true ) {
        pbVar8 = pbVar1 + 1;
        bVar5 = *pbVar1;
        if (((ulong)bVar5 < 0x30) && ((0xa00000000001U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) break;
        iVar2 = iVar2 + 1;
        pbVar1 = pbVar8;
      }
      if (((uVar7 == 0) && (bVar5 == 0)) || (uVar3 = IsRegister(oper,iVar2), (int)uVar3 < 0)) break;
      if (bVar9) {
        uVar4 = uVar3;
        if ((int)unaff_EBX < (int)uVar3) {
          uVar4 = unaff_EBX;
        }
        uVar6 = uVar4;
        if ((int)uVar3 < (int)unaff_EBX) {
          uVar3 = unaff_EBX;
        }
        for (; (int)uVar6 <= (int)uVar3; uVar6 = uVar6 + 1) {
          uVar7 = uVar7 | 1 << (uVar6 & 0x1f);
        }
        bVar5 = *pbVar1;
        uVar3 = uVar4;
        if (bVar5 == 0x2d) {
          return 0;
        }
      }
      else {
        uVar7 = uVar7 | 1 << (uVar3 & 0x1f);
        bVar5 = *pbVar1;
      }
      if (bVar5 == 0) {
        return uVar7;
      }
      bVar9 = bVar5 == 0x2d;
      oper = (char *)pbVar8;
      unaff_EBX = uVar3;
      if (*pbVar8 == 0) {
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int 
GetMultReg (char *oper, int loc)
/* Builds a register mask for the MOVEM instruction.
 Returns the mask in the low-order portion of its value if
 "oper" is a valid multiple-register list; otherwise returns 0. */
{
	register char *s, *t;
	register int j;
	int t1, t2; /* Temporary variables for registers */
	int range; /* We're processing a range of registers. */
	int multext; /* The result is built here. */

	multext = 0;
	range = FALSE;
	s = oper;
	if (IsOperator(s))
		return (0); /* Starts with an operator! */

	while (1) {
		for (t = s; *t; t++) {
			if ((*t == '-') || (*t == '/')) {
				break;
			}
		}
		if ((multext == 0) && (*t == '\0'))
			return (0); /* Reject single term. */
		if ((t2 = IsRegister(s, (int) (t - s))) < 0)
			return (0); /* Not a recognizable register */

		if (!range) {
			multext |= (1 << t2); /* Single register */
			t1 = t2; /* Save number in case it's a range. */
		} else { /* Range of registers */
			range = FALSE;
			if (t1 > t2) {
				j = t1; /* Swap registers if backwards. */
				t1 = t2;
				t2 = j;
			}
			for (j = t1; j <= t2; j++)
				multext |= (1 << j); /* Mark all registers in range. */
			if (*t == '-')
				return (0); /* Invalid range */
		}
		if (*t == '\0')
			break; /* Normal end of operand */
		if (*t++ == '-')
			range = TRUE; /* Range indicator */
		if (*t == '\0')
			return (0); /* Premature end of operand */
		s = t;
	}
	return (multext);
}